

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char **arr)

{
  char **ppcVar1;
  uint uVar2;
  Fl_Tree_Item *pFVar3;
  int iVar4;
  ulong uVar5;
  
  do {
    uVar2 = (this->_children)._total;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    uVar5 = 0;
    while( true ) {
      if (uVar2 == uVar5) {
        return (Fl_Tree_Item *)0x0;
      }
      pFVar3 = (this->_children)._items[uVar5];
      if ((pFVar3->_label != (char *)0x0) && (iVar4 = strcmp(pFVar3->_label,*arr), iVar4 == 0))
      break;
      uVar5 = uVar5 + 1;
    }
    ppcVar1 = arr + 1;
    arr = arr + 1;
    this = pFVar3;
  } while (*ppcVar1 != (char *)0x0);
  return pFVar3;
}

Assistant:

const Fl_Tree_Item *Fl_Tree_Item::find_child_item(char **arr) const {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), *arr) == 0 ) {	// match?
        if ( *(arr+1) ) {				// more in arr? descend
          return(_children[t]->find_child_item(arr+1));
        } else {					// end of arr? done
          return(_children[t]);
        }
      }
    }
  }
  return(0);
}